

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

char * gguf_get_val_str(gguf_context *ctx,int64_t key_id)

{
  int64_t iVar1;
  size_t sVar2;
  char *pcVar3;
  size_type in_RSI;
  size_t in_RDI;
  gguf_kv *unaff_retaddr;
  
  if (-1 < (long)in_RSI) {
    iVar1 = gguf_get_n_kv((gguf_context *)0x18fbc9);
    if ((long)in_RSI < iVar1) {
      std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)(in_RDI + 8),in_RSI);
      sVar2 = gguf_kv::get_ne((gguf_kv *)key_id);
      if (sVar2 != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
                   ,0x366,"GGML_ASSERT(%s) failed","ctx->kv[key_id].get_ne() == 1");
      }
      std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)(in_RDI + 8),in_RSI);
      gguf_kv::get_val<std::__cxx11::string>(unaff_retaddr,in_RDI);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      return pcVar3;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
             ,0x365,"GGML_ASSERT(%s) failed","key_id >= 0 && key_id < gguf_get_n_kv(ctx)");
}

Assistant:

const char * gguf_get_val_str(const struct gguf_context * ctx, int64_t key_id) {
    GGML_ASSERT(key_id >= 0 && key_id < gguf_get_n_kv(ctx));
    GGML_ASSERT(ctx->kv[key_id].get_ne() == 1);
    return ctx->kv[key_id].get_val<std::string>().c_str();
}